

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O0

bool __thiscall Analyzer::isVarCanBeString(Analyzer *this,Node *node)

{
  bool bVar1;
  int iVar2;
  reference ppNVar3;
  size_type sVar4;
  reference pvVar5;
  Analyzer *in_RSI;
  int i;
  char *fnName_1;
  char *fnName;
  int local_2c;
  Node *in_stack_ffffffffffffffd8;
  Node *in_stack_ffffffffffffffe0;
  bool local_1;
  
  if (in_RSI == (Analyzer *)0x0) {
    local_1 = false;
  }
  else if (*(int *)&(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_parent == 5) {
    local_1 = true;
  }
  else if (((*(int *)&(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header._M_header.
                      _M_parent == 0xf) &&
           (**(int **)&(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header._M_header ==
            0x34)) &&
          (ppNVar3 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                               ((vector<Node_*,_std::allocator<Node_*>_> *)
                                &(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header.
                                 _M_header._M_left,0), (*ppNVar3)->nodeType == PNT_STRING)) {
    std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
              ((vector<Node_*,_std::allocator<Node_*>_> *)
               &(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,0
              );
    local_1 = isVarCanBeString(in_RSI,in_stack_ffffffffffffffe0);
  }
  else {
    if ((*(int *)&(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_parent == 0x17) &&
       (ppNVar3 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                            ((vector<Node_*,_std::allocator<Node_*>_> *)
                             &(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header.
                              _M_header._M_left,0), (*ppNVar3)->nodeType == PNT_ACCESS_MEMBER)) {
      ppNVar3 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                          ((vector<Node_*,_std::allocator<Node_*>_> *)
                           &(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header.
                            _M_header._M_left,0);
      ppNVar3 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[](&(*ppNVar3)->children,1);
      if ((*ppNVar3)->nodeType == PNT_IDENTIFIER) {
        ppNVar3 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                            ((vector<Node_*,_std::allocator<Node_*>_> *)
                             &(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header.
                              _M_header._M_left,0);
        ppNVar3 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[](&(*ppNVar3)->children,1);
        in_stack_ffffffffffffffe0 = (Node *)((*ppNVar3)->tok->u).s;
        bVar1 = settings::find((char *)in_RSI,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)in_stack_ffffffffffffffe0);
        if (bVar1) {
          return true;
        }
      }
    }
    if ((*(int *)&(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_parent == 0x17) &&
       (ppNVar3 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                            ((vector<Node_*,_std::allocator<Node_*>_> *)
                             &(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header.
                              _M_header._M_left,0), (*ppNVar3)->nodeType == PNT_IDENTIFIER)) {
      ppNVar3 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                          ((vector<Node_*,_std::allocator<Node_*>_> *)
                           &(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header.
                            _M_header._M_left,0);
      in_stack_ffffffffffffffd8 = (Node *)((*ppNVar3)->tok->u).s;
      iVar2 = strcmp((char *)in_stack_ffffffffffffffd8,"loc");
      if (iVar2 == 0) {
        return true;
      }
    }
    sVar4 = std::
            vector<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
            ::size(&nearest_assignments);
    local_2c = (int)sVar4;
    do {
      do {
        local_2c = local_2c + -1;
        if (local_2c < 0) goto LAB_00153435;
        pvVar5 = std::
                 vector<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
                 ::operator[](&nearest_assignments,(long)local_2c);
      } while (pvVar5->first == (Node *)0x0);
      std::
      vector<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
      ::operator[](&nearest_assignments,(long)local_2c);
      bVar1 = isNodeEquals(in_RSI,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    } while (!bVar1);
    pvVar5 = std::
             vector<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
             ::operator[](&nearest_assignments,(long)local_2c);
    if (((pvVar5->second).first)->nodeType == PNT_STRING) {
      local_1 = true;
    }
    else {
LAB_00153435:
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool isVarCanBeString(Node * node)
  {
    if (!node)
      return false;

    if (node->nodeType == PNT_STRING)
      return true;

    if (node->nodeType == PNT_BINARY_OP && node->tok.type == TK_NULLCOALESCE &&
      node->children[0]->nodeType == PNT_STRING)
    {
      return isVarCanBeString(node->children[0]);
    }

    if (node->nodeType == PNT_FUNCTION_CALL && node->children[0]->nodeType == PNT_ACCESS_MEMBER &&
      node->children[0]->children[1]->nodeType == PNT_IDENTIFIER)
    {
      const char * fnName = node->children[0]->children[1]->tok.u.s;
      if (settings::find(fnName, settings::function_can_return_string))
        return true;
    }

    if (node->nodeType == PNT_FUNCTION_CALL && node->children[0]->nodeType == PNT_IDENTIFIER)
    {
      const char * fnName = node->children[0]->tok.u.s;
      if (
        !strcmp(fnName, "loc")
        )
      {
        return true;
      }
    }



    for (int i = int(nearest_assignments.size()) - 1; i >= 0; i--)
      if (nearest_assignments[i].first && isNodeEquals(node, nearest_assignments[i].first))
      {
        if (nearest_assignments[i].second.first->nodeType == PNT_STRING)
          return true;
        break;
      }

    return false;
  }